

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O1

bool __thiscall Nibbler::getName(Nibbler *this,string *result)

{
  ulong uVar1;
  ulong uVar2;
  pointer pcVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long *local_50 [2];
  long local_40 [2];
  
  uVar1 = this->_length;
  uVar2 = this->_cursor;
  if (uVar2 < uVar1) {
    pcVar3 = (this->_input)._M_dataplus._M_p;
    iVar6 = (int)pcVar3[uVar2];
    uVar8 = uVar2;
    if (((9 < iVar6 - 0x30U) && (iVar4 = ispunct(iVar6), iVar4 == 0)) &&
       (iVar6 = isspace(iVar6), uVar7 = uVar2, uVar5 = uVar2, iVar6 == 0)) {
      while (uVar5 = uVar5 + 1, uVar8 = uVar1, uVar1 != uVar5) {
        iVar4 = (int)pcVar3[uVar5];
        iVar6 = ispunct(iVar4);
        uVar8 = uVar7 + 1;
        if ((iVar6 != 0) || (iVar6 = isspace(iVar4), uVar7 = uVar7 + 1, uVar8 = uVar5, iVar6 != 0))
        break;
      }
    }
    if (uVar2 < uVar8) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this);
      std::__cxx11::string::operator=((string *)result,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      this->_cursor = uVar8;
      return true;
    }
  }
  return false;
}

Assistant:

bool Nibbler::getName (std::string& result)
{
  std::string::size_type i = _cursor;

  if (i < _length)
  {
    if (! isdigit (_input[i]) &&
        ! ispunct (_input[i]) &&
        ! isspace (_input[i]))
    {
      ++i;
      while (i < _length &&
             ! ispunct (_input[i]) &&
             ! isspace (_input[i]))
      {
        ++i;
      }
    }

    if (i > _cursor)
    {
      result = _input.substr (_cursor, i - _cursor);
      _cursor = i;
      return true;
    }
  }

  return false;
}